

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cc
# Opt level: O2

void __thiscall
klogic::mvn::learn(mvn *this,const_iterator Xbeg,const_iterator Xend,cmplx *error,
                  double learning_rate,bool variable_rate)

{
  long lVar1;
  long lVar2;
  pointer pcVar3;
  pointer pcVar4;
  double dVar5;
  double extraout_XMM0_Qa;
  undefined1 auVar6 [16];
  double dVar9;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 local_58 [16];
  complex<double> local_48;
  undefined1 local_38 [16];
  
  pcVar3 = (this->weights).
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar1 = (long)(this->weights).
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pcVar3;
  lVar2 = lVar1 >> 4;
  if (lVar2 == ((long)Xend._M_current - (long)Xbeg._M_current >> 4) + 1) {
    auVar6._8_4_ = (int)(lVar1 >> 0x24);
    auVar6._0_8_ = lVar2;
    auVar6._12_4_ = 0x45300000;
    dVar5 = (double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0;
    dVar9 = auVar6._8_8_ - 1.9342813113834067e+25;
    auVar10._0_8_ = learning_rate * *(double *)error->_M_value;
    auVar10._8_8_ = learning_rate * *(double *)(error->_M_value + 8);
    auVar7._0_8_ = dVar9 + dVar5;
    auVar7._8_8_ = dVar9 + dVar5;
    local_48._M_value = (_ComplexT)divpd(auVar10,auVar7);
    if (variable_rate) {
      local_38 = (undefined1  [16])local_48._M_value;
      weighted_sum(this,Xbeg,Xend);
      local_58._8_8_ = dVar5;
      auVar8._0_8_ = std::abs<double>((complex<double> *)local_58);
      auVar8._8_8_ = auVar8._0_8_;
      local_48._M_value = (_ComplexT)divpd(local_38,auVar8);
      pcVar3 = (this->weights).
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    dVar5 = *(double *)(pcVar3->_M_value + 8);
    *(double *)pcVar3->_M_value = *(double *)pcVar3->_M_value + local_48._M_value._0_8_;
    *(double *)(pcVar3->_M_value + 8) = dVar5 + local_48._M_value._8_8_;
    while (pcVar4 = pcVar3 + 1,
          pcVar4 != (this->weights).
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
      local_58._0_8_ = *(undefined8 *)(Xbeg._M_current)->_M_value;
      dVar9 = -*(double *)((Xbeg._M_current)->_M_value + 8);
      local_58._8_8_ = dVar9;
      std::operator*(&local_48,(complex<double> *)local_58);
      dVar5 = *(double *)(pcVar3[1]._M_value + 8);
      *(double *)pcVar4->_M_value = extraout_XMM0_Qa + *(double *)pcVar4->_M_value;
      *(double *)(pcVar3[1]._M_value + 8) = dVar9 + dVar5;
      Xbeg._M_current = Xbeg._M_current + 1;
      pcVar3 = pcVar4;
    }
    return;
  }
  __assert_fail("weights.size() == Xend - Xbeg + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/lib/mvn.cc",
                0x28,
                "void klogic::mvn::learn(cvector::const_iterator, cvector::const_iterator, const cmplx &, double, bool)"
               );
}

Assistant:

void klogic::mvn::learn(cvector::const_iterator Xbeg,
                        cvector::const_iterator Xend,
                        const cmplx &error, double learning_rate, bool variable_rate)
{
    assert(weights.size() == Xend - Xbeg + 1);

    cmplx factor = error * learning_rate / (double)weights.size(); // division by N+1

    if (variable_rate)
        factor /= std::abs(weighted_sum(Xbeg, Xend));

    cvector::iterator       w = weights.begin();
    cvector::const_iterator x = Xbeg;

    // cout << "learn(): error=" << error << " factor=" << factor << "weights before: " << weights_vector() << endl;

    *w++ += factor;         // change bias

    for (; w != weights.end(); w++, x++) {
        *w += factor * std::conj(*x);
    }

    // cout << "learn(): weights after: " << weights_vector() << endl;

}